

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O1

int find_minlength(pcre2_real_code_16 *re,PCRE2_SPTR16 code,PCRE2_SPTR16 startcode,BOOL utf,
                  recurse_check *recurses,int *countptr,int *backref_cache)

{
  PCRE2_UCHAR16 PVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  recurse_check **pprVar5;
  uint uVar6;
  ulong uVar7;
  PCRE2_SPTR16 pPVar8;
  PCRE2_SPTR16 pPVar9;
  recurse_check *prVar10;
  ushort *puVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint8_t *puVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  PCRE2_SPTR16 code_00;
  uint uVar20;
  int *piVar21;
  int *piVar22;
  bool bVar23;
  recurse_check this_recurse;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  recurse_check local_40;
  
  PVar1 = *code;
  uVar6 = 0;
  if (4 < (ushort)(PVar1 - 0x88)) {
    uVar3 = re->flags;
    iVar12 = *countptr;
    *countptr = iVar12 + 1;
    piVar21 = (int *)0xffffffff;
    uVar6 = 0xffffffff;
    if (iVar12 < 0x3e9) {
      code_00 = code + (ulong)((ushort)(PVar1 - 0x85) < 2) + 2;
      local_5c = 0;
      local_68 = 0xffffffff;
      local_60 = 0xffffffff;
      local_64 = 0;
      local_6c = 0;
      bVar4 = false;
      uVar18 = 0xffffffff;
      uVar17 = 0;
      piVar19 = countptr;
      uVar20 = uVar6;
      do {
        if (0xfffe < (int)uVar17) {
          piVar21 = (int *)0xffff;
          uVar20 = 0xffff;
          goto LAB_001605b0;
        }
        uVar2 = *code_00;
        uVar7 = (ulong)uVar2;
        puVar11 = code_00;
        uVar6 = uVar20;
        switch(uVar7) {
        case 0:
        case 0x78:
        case 0x79:
        case 0x7a:
        case 0x7b:
        case 0x7c:
          if (((int)uVar18 < 0) || ((!bVar4 && ((int)uVar17 < (int)uVar18)))) {
            uVar18 = uVar17;
          }
          bVar23 = false;
          if (uVar2 == 0x78) {
            bVar23 = true;
            bVar4 = false;
            uVar17 = 0;
            code_00 = code_00 + 2;
          }
          else {
            piVar21 = (int *)(ulong)uVar18;
            uVar6 = uVar18;
          }
          break;
        case 1:
        case 2:
        case 4:
        case 5:
        case 0x17:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x76:
        case 0x7d:
        case 0x8d:
        case 0x8e:
        case 0x8f:
        case 0x90:
        case 0x91:
        case 0x92:
          goto switchD_001605cf_caseD_1;
        case 3:
        case 0x21:
        case 0x22:
        case 0x25:
        case 0x26:
        case 0x27:
        case 0x28:
        case 0x2a:
        case 0x2c:
        case 0x2d:
        case 0x2e:
        case 0x2f:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x37:
        case 0x39:
        case 0x3a:
        case 0x3b:
        case 0x3c:
        case 0x3f:
        case 0x40:
        case 0x41:
        case 0x42:
        case 0x44:
        case 0x46:
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4c:
        case 0x4d:
        case 0x4e:
        case 0x4f:
        case 0x51:
        case 0x53:
        case 0x54:
        case 0x97:
        case 0x99:
        case 0x9b:
        case 0x9d:
        case 0x9f:
        case 0xa2:
          uVar7 = (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                         [uVar7];
          goto LAB_00160600;
        case 6:
        case 7:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x16:
          goto switchD_001605cf_caseD_6;
        case 0xf:
        case 0x10:
          puVar11 = code_00 + 2;
          goto switchD_001605cf_caseD_6;
        case 0x1d:
        case 0x1e:
        case 0x1f:
        case 0x20:
        case 0x23:
        case 0x24:
        case 0x2b:
        case 0x30:
        case 0x31:
        case 0x38:
        case 0x3d:
        case 0x3e:
        case 0x45:
        case 0x4a:
        case 0x4b:
        case 0x52:
          uVar17 = uVar17 + 1;
          goto LAB_001607c0;
        case 0x29:
        case 0x36:
        case 0x43:
        case 0x50:
switchD_001605cf_caseD_29:
          uVar17 = uVar17 + puVar11[1];
          puVar11 = puVar11 + 3;
          goto LAB_00160a97;
        case 0x55:
        case 0x56:
        case 0x59:
        case 0x5a:
        case 0x5e:
        case 0x60:
          pPVar8 = code_00 + (ulong)((ushort)(code_00[1] - 0xf) < 2) * 2;
          goto LAB_00160765;
        case 0x57:
        case 0x58:
        case 0x5f:
          uVar17 = uVar17 + 1;
          puVar11 = code_00 + (ulong)((ushort)(code_00[1] - 0xf) < 2) * 2 + 2;
          goto LAB_00160a97;
        case 0x5b:
        case 0x5c:
        case 0x61:
          pPVar8 = code_00 + 2;
          if (1 < (ushort)(code_00[2] - 0xf)) {
            pPVar8 = code_00;
          }
LAB_00160765:
          puVar11 = pPVar8 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                             [uVar7];
          goto LAB_00160a97;
        case 0x5d:
          uVar17 = uVar17 + code_00[1];
          puVar11 = code_00 + (ulong)((ushort)(code_00[2] - 0xf) < 2) * 2 + 3;
          goto LAB_00160a97;
        default:
          piVar21 = (int *)0xfffffffd;
          uVar20 = 0xfffffffd;
          goto LAB_001605b0;
        case 0x6e:
        case 0x6f:
        case 0x70:
          if (uVar2 == 0x70) {
            uVar7 = (ulong)code_00[1];
          }
          else {
            uVar7 = 0x11;
          }
          puVar11 = code_00 + uVar7;
          uVar6 = *puVar11 - 0x62;
          if (0xb < uVar6) {
            uVar17 = uVar17 + 1;
            goto LAB_00160a97;
          }
          if ((0x533U >> (uVar6 & 0x1f) & 1) == 0) {
            if ((0x20cU >> (uVar6 & 0x1f) & 1) == 0) goto switchD_001605cf_caseD_29;
            goto switchD_001605cf_caseD_6;
          }
          goto LAB_00160a93;
        case 0x71:
        case 0x72:
          if ((uVar3 >> 0x15 & 1) != 0) goto switchD_001605cf_caseD_a0;
          uVar2 = code_00[1];
          if ((int)(uint)uVar2 <= *backref_cache) {
            lVar13 = 4;
            if (-1 < backref_cache[uVar2]) {
              piVar19 = (int *)(ulong)(uint)backref_cache[uVar2];
              goto LAB_00160f09;
            }
          }
          if ((re->overall_options & 0x200) == 0) {
            pPVar9 = _pcre2_find_bracket_16(startcode,utf,(uint)uVar2);
            pPVar8 = pPVar9;
            if (pPVar9 != (PCRE2_SPTR16)0x0) {
              do {
                pPVar8 = pPVar8 + pPVar8[1];
              } while (*pPVar8 == 0x78);
              if ((pPVar9 < code_00) && (code_00 < pPVar8)) {
                piVar19 = (int *)0x0;
                bVar4 = true;
              }
              else {
                prVar10 = recurses;
                if (recurses != (recurse_check *)0x0) {
                  do {
                    if (prVar10->group == pPVar9) {
                      piVar19 = (int *)0x0;
                      bVar23 = true;
                      bVar4 = true;
                      goto LAB_00160eba;
                    }
                    pprVar5 = &prVar10->prev;
                    prVar10 = *pprVar5;
                  } while (*pprVar5 != (recurse_check *)0x0);
                }
                local_40.prev = recurses;
                local_40.group = pPVar9;
                uVar6 = find_minlength(re,pPVar9,startcode,utf,&local_40,countptr,backref_cache);
                piVar19 = (int *)(ulong)uVar6;
                bVar23 = -1 < (int)uVar6;
                uVar20 = (uint)piVar21;
                if (!bVar23) {
                  piVar21 = (int *)(ulong)uVar6;
                  uVar20 = uVar6;
                }
LAB_00160eba:
                if (!bVar23) {
                  bVar23 = false;
                  goto LAB_00160efc;
                }
              }
              goto LAB_00160cb9;
            }
            piVar21 = (int *)0xfffffffe;
            uVar20 = 0xfffffffe;
            bVar23 = false;
            piVar19 = (int *)((ulong)piVar19 & 0xffffffff);
          }
          else {
            piVar19 = (int *)0x0;
LAB_00160cb9:
            uVar6 = (uint)uVar2;
            backref_cache[uVar2] = (int)piVar19;
            iVar12 = *backref_cache;
            if (iVar12 + 1 < (int)uVar6) {
              memset(backref_cache + (long)iVar12 + 1,0xff,(ulong)((uVar6 - iVar12) - 2) * 4 + 4);
            }
            *backref_cache = uVar6;
            bVar23 = true;
          }
LAB_00160efc:
          lVar13 = 4;
joined_r0x00160dca:
          if (bVar23) goto LAB_00160f09;
LAB_001605b0:
          bVar23 = false;
          uVar6 = uVar20;
          break;
        case 0x73:
        case 0x74:
          if ((uVar3 >> 0x15 & 1) != 0) goto LAB_00160a54;
          lVar13 = 6;
          if ((re->overall_options & 0x200) == 0) {
            uVar6 = (uint)code_00[2];
            puVar16 = re[1].start_bitmap +
                      (ulong)re->name_entry_size * (ulong)code_00[1] * 2 + -0x28;
            piVar19 = (int *)0x7fffffff;
            do {
              bVar23 = true;
              if ((int)uVar6 < 1) goto LAB_00160dc8;
              uVar2 = *(ushort *)puVar16;
              if ((*backref_cache < (int)(uint)uVar2) ||
                 (piVar22 = (int *)(ulong)(uint)backref_cache[uVar2], backref_cache[uVar2] < 0)) {
                pPVar9 = _pcre2_find_bracket_16(startcode,utf,(uint)uVar2);
                pPVar8 = pPVar9;
                if (pPVar9 != (PCRE2_SPTR16)0x0) {
                  do {
                    pPVar8 = pPVar8 + pPVar8[1];
                  } while (*pPVar8 == 0x78);
                  if ((pPVar9 < code_00) && (code_00 < pPVar8)) {
                    piVar22 = (int *)0x0;
                    bVar4 = true;
                  }
                  else {
                    prVar10 = recurses;
                    if (recurses != (recurse_check *)0x0) {
                      do {
                        if (prVar10->group == pPVar9) {
                          piVar22 = (int *)0x0;
                          bVar23 = true;
                          bVar4 = true;
                          goto LAB_00160932;
                        }
                        pprVar5 = &prVar10->prev;
                        prVar10 = *pprVar5;
                      } while (*pprVar5 != (recurse_check *)0x0);
                    }
                    local_40.prev = recurses;
                    local_40.group = pPVar9;
                    uVar14 = find_minlength(re,pPVar9,startcode,utf,&local_40,countptr,backref_cache
                                           );
                    piVar22 = (int *)(ulong)uVar14;
                    bVar23 = -1 < (int)uVar14;
                    piVar21 = (int *)(ulong)uVar20;
                    if (!bVar23) {
                      piVar21 = piVar22;
                      uVar20 = uVar14;
                    }
LAB_00160932:
                    if (!bVar23) {
                      iVar12 = 1;
                      bVar23 = false;
                      goto LAB_001609ee;
                    }
                  }
                  backref_cache[(uint)uVar2] = (int)piVar22;
                  iVar12 = *backref_cache;
                  if (iVar12 + 1 < (int)(uint)uVar2) {
                    memset(backref_cache + (long)iVar12 + 1,0xff,
                           (ulong)(((uint)uVar2 - iVar12) - 2) * 4 + 4);
                  }
                  *backref_cache = (uint)uVar2;
                  goto LAB_001609a5;
                }
                piVar21 = (int *)0xfffffffe;
                uVar20 = 0xfffffffe;
                iVar12 = 1;
                bVar23 = false;
              }
              else {
LAB_001609a5:
                if ((int)piVar22 < (int)piVar19) {
                  piVar19 = piVar22;
                }
                iVar12 = 0;
                if ((int)piVar19 < 1) {
                  iVar12 = 0x10;
                  bVar23 = false;
                }
                else {
                  puVar16 = puVar16 + (ulong)re->name_entry_size * 2;
                  bVar23 = true;
                }
              }
LAB_001609ee:
              uVar6 = uVar6 - 1;
            } while (iVar12 == 0);
            if (iVar12 == 0x10) {
              bVar23 = true;
            }
LAB_00160dc8:
            lVar13 = 6;
            goto joined_r0x00160dca;
          }
          piVar19 = (int *)0x0;
LAB_00160f09:
          puVar11 = (ushort *)(lVar13 + (long)code_00);
          uVar6 = 1;
          uVar14 = *(ushort *)((long)code_00 + lVar13) - 0x62;
          if (uVar14 < 0xc) {
            if ((0x533U >> (uVar14 & 0x1f) & 1) == 0) {
              if ((0x20cU >> (uVar14 & 0x1f) & 1) == 0) {
                uVar6 = (uint)puVar11[1];
                puVar11 = puVar11 + 3;
              }
              else {
                puVar11 = puVar11 + 1;
              }
            }
            else {
              puVar11 = puVar11 + 1;
              uVar6 = 0;
            }
          }
          if (((int)piVar19 < 1) || (uVar6 <= (uint)(0x7fffffff / (ulong)piVar19))) {
            iVar15 = 0xffff - uVar17;
            iVar12 = uVar6 * (int)piVar19;
            uVar17 = uVar17 + iVar12;
            if (iVar15 < iVar12) {
              uVar17 = 0xffff;
            }
            goto LAB_00160a97;
          }
          bVar23 = true;
          uVar17 = 0xffff;
          code_00 = puVar11;
          uVar6 = uVar20;
          break;
        case 0x75:
          pPVar8 = startcode + code_00[1];
          uVar2 = pPVar8[2];
          pPVar9 = pPVar8;
          if (local_60 == uVar2) {
            uVar17 = uVar17 + local_64;
          }
          else {
            do {
              pPVar9 = pPVar9 + pPVar9[1];
            } while (*pPVar9 == 0x78);
            if ((pPVar8 < code_00) && (code_00 < pPVar9)) {
              bVar4 = true;
            }
            else {
              prVar10 = recurses;
              if (recurses != (recurse_check *)0x0) {
                do {
                  if (prVar10->group == pPVar8) {
                    bVar23 = true;
                    bVar4 = true;
                    goto LAB_00160e9b;
                  }
                  pprVar5 = &prVar10->prev;
                  prVar10 = *pprVar5;
                } while (*pprVar5 != (recurse_check *)0x0);
              }
              local_40.prev = recurses;
              local_40.group = pPVar8;
              local_64 = find_minlength(re,pPVar8,startcode,utf,&local_40,countptr,backref_cache);
              if ((int)local_64 < 0) {
                piVar21 = (int *)(ulong)local_64;
                uVar20 = local_64;
              }
              else {
                uVar17 = uVar17 + local_64;
                local_60 = (uint)uVar2;
              }
              bVar23 = (int)local_64 >= 0;
              piVar19 = (int *)((ulong)piVar19 & 0xffffffff);
LAB_00160e9b:
              if (!bVar23) goto LAB_00160c19;
            }
          }
          uVar7 = (ulong)local_6c;
          bVar23 = true;
          local_6c = 0;
          code_00 = code_00 + uVar7 + 2;
          uVar6 = uVar20;
          break;
        case 0x77:
          uVar7 = (ulong)code_00[3];
          goto LAB_00160600;
        case 0x7e:
        case 0x7f:
        case 0x80:
        case 0x81:
          do {
            code_00 = code_00 + code_00[1];
          } while (*code_00 == 0x78);
          goto switchD_001605cf_caseD_1;
        case 0x82:
        case 0x84:
        case 0x88:
        case 0x89:
switchD_001605cf_caseD_82:
          uVar6 = find_minlength(re,code_00,startcode,utf,recurses,countptr,backref_cache);
          piVar19 = (int *)(ulong)uVar6;
          if ((int)uVar6 < 0) {
            bVar23 = false;
            piVar21 = piVar19;
          }
          else {
            do {
              code_00 = code_00 + code_00[1];
            } while (*code_00 == 0x78);
            uVar17 = uVar17 + uVar6;
            code_00 = code_00 + 2;
            bVar23 = true;
            uVar6 = uVar20;
          }
          break;
        case 0x83:
          if ((code_00[2] != 0x75) || (code_00[4] != 0x79)) goto switchD_001605cf_caseD_82;
          bVar23 = true;
          local_6c = 2;
          code_00 = code_00 + 2;
          break;
        case 0x85:
        case 0x86:
        case 0x8a:
        case 0x8b:
          uVar20 = (uint)code_00[2];
          if (((uVar3 >> 0x15 & 1) != 0) || (local_68 != uVar20)) {
            local_5c = find_minlength(re,code_00,startcode,utf,recurses,countptr,backref_cache);
            local_68 = uVar20;
            if ((int)local_5c < 0) {
              piVar21 = (int *)(ulong)local_5c;
              piVar19 = (int *)((ulong)piVar19 & 0xffffffff);
              uVar20 = local_5c;
LAB_00160c19:
              bVar23 = false;
              uVar6 = uVar20;
              break;
            }
            piVar19 = (int *)((ulong)piVar19 & 0xffffffff);
          }
          do {
            code_00 = code_00 + code_00[1];
          } while (*code_00 == 0x78);
          uVar17 = uVar17 + local_5c;
          bVar23 = true;
          code_00 = code_00 + 2;
          break;
        case 0x87:
        case 0x8c:
          if (code_00[code_00[1]] == 0x78) goto switchD_001605cf_caseD_82;
          code_00 = code_00 + code_00[1];
          goto LAB_001607c0;
        case 0x93:
        case 0x94:
        case 0x95:
        case 0xa3:
          code_00 = code_00 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                              [uVar7];
          do {
            code_00 = code_00 + code_00[1];
          } while (*code_00 == 0x78);
LAB_001607c0:
          puVar11 = code_00 + 2;
          goto LAB_00160a97;
        case 0x96:
        case 0x98:
        case 0x9a:
        case 0x9c:
        case 0x9e:
          puVar11 = code_00 + ((uint)code_00[1] +
                              (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                                    [uVar7]);
LAB_00160a97:
          bVar23 = true;
          code_00 = puVar11;
          uVar6 = uVar20;
          break;
        case 0xa0:
        case 0xa1:
switchD_001605cf_caseD_a0:
LAB_00160a54:
          bVar23 = false;
          piVar21 = (int *)0xffffffff;
          uVar6 = 0xffffffff;
        }
        uVar20 = uVar6;
      } while (bVar23);
    }
  }
  return uVar6;
switchD_001605cf_caseD_6:
  uVar17 = uVar17 + 1;
LAB_00160a93:
  puVar11 = puVar11 + 1;
  goto LAB_00160a97;
switchD_001605cf_caseD_1:
  uVar7 = (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x02\x02\x02\x02\x02\x02\x03\x03\x03\x02\x02\x02\x03\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x03\x11\x11"
                 [*code_00];
LAB_00160600:
  puVar11 = code_00 + uVar7;
  goto LAB_00160a97;
}

Assistant:

static int
find_minlength(const pcre2_real_code *re, PCRE2_SPTR code,
  PCRE2_SPTR startcode, BOOL utf, recurse_check *recurses, int *countptr,
  int *backref_cache)
{
int length = -1;
int prev_cap_recno = -1;
int prev_cap_d = 0;
int prev_recurse_recno = -1;
int prev_recurse_d = 0;
uint32_t once_fudge = 0;
BOOL had_recurse = FALSE;
BOOL dupcapused = (re->flags & PCRE2_DUPCAPUSED) != 0;
recurse_check this_recurse;
int branchlength = 0;
PCRE2_UCHAR *cc = (PCRE2_UCHAR *)code + 1 + LINK_SIZE;

/* If this is a "could be empty" group, its minimum length is 0. */

if (*code >= OP_SBRA && *code <= OP_SCOND) return 0;

/* Skip over capturing bracket number */

if (*code == OP_CBRA || *code == OP_CBRAPOS) cc += IMM2_SIZE;

/* A large and/or complex regex can take too long to process. */

if ((*countptr)++ > 1000) return -1;

/* Scan along the opcodes for this branch. If we get to the end of the branch,
check the length against that of the other branches. If the accumulated length
passes 16-bits, stop. */

for (;;)
  {
  int d, min, recno;
  PCRE2_UCHAR *cs, *ce;
  PCRE2_UCHAR op = *cc;

  if (branchlength >= UINT16_MAX) return UINT16_MAX;

  switch (op)
    {
    case OP_COND:
    case OP_SCOND:

    /* If there is only one branch in a condition, the implied branch has zero
    length, so we don't add anything. This covers the DEFINE "condition"
    automatically. If there are two branches we can treat it the same as any
    other non-capturing subpattern. */

    cs = cc + GET(cc, 1);
    if (*cs != OP_ALT)
      {
      cc = cs + 1 + LINK_SIZE;
      break;
      }
    goto PROCESS_NON_CAPTURE;

    case OP_BRA:
    /* There's a special case of OP_BRA, when it is wrapped round a repeated
    OP_RECURSE. We'd like to process the latter at this level so that
    remembering the value works for repeated cases. So we do nothing, but
    set a fudge value to skip over the OP_KET after the recurse. */

    if (cc[1+LINK_SIZE] == OP_RECURSE && cc[2*(1+LINK_SIZE)] == OP_KET)
      {
      once_fudge = 1 + LINK_SIZE;
      cc += 1 + LINK_SIZE;
      break;
      }
    /* Fall through */

    case OP_ONCE:
    case OP_SBRA:
    case OP_BRAPOS:
    case OP_SBRAPOS:
    PROCESS_NON_CAPTURE:
    d = find_minlength(re, cc, startcode, utf, recurses, countptr,
      backref_cache);
    if (d < 0) return d;
    branchlength += d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* To save time for repeated capturing subpatterns, we remember the
    length of the previous one. Unfortunately we can't do the same for
    the unnumbered ones above. Nor can we do this if (?| is present in the
    pattern because captures with the same number are not then identical. */

    case OP_CBRA:
    case OP_SCBRA:
    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    recno = (int)GET2(cc, 1+LINK_SIZE);
    if (dupcapused || recno != prev_cap_recno)
      {
      prev_cap_recno = recno;
      prev_cap_d = find_minlength(re, cc, startcode, utf, recurses, countptr,
        backref_cache);
      if (prev_cap_d < 0) return prev_cap_d;
      }
    branchlength += prev_cap_d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* ACCEPT makes things far too complicated; we have to give up. */

    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    return -1;

    /* Reached end of a branch; if it's a ket it is the end of a nested
    call. If it's ALT it is an alternation in a nested call. If it is END it's
    the end of the outer call. All can be handled by the same code. If an
    ACCEPT was previously encountered, use the length that was in force at that
    time, and pass back the shortest ACCEPT length. */

    case OP_ALT:
    case OP_KET:
    case OP_KETRMAX:
    case OP_KETRMIN:
    case OP_KETRPOS:
    case OP_END:
    if (length < 0 || (!had_recurse && branchlength < length))
      length = branchlength;
    if (op != OP_ALT) return length;
    cc += 1 + LINK_SIZE;
    branchlength = 0;
    had_recurse = FALSE;
    break;

    /* Skip over assertive subpatterns */

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    /* Fall through */

    /* Skip over things that don't match chars */

    case OP_REVERSE:
    case OP_CREF:
    case OP_DNCREF:
    case OP_RREF:
    case OP_DNRREF:
    case OP_FALSE:
    case OP_TRUE:
    case OP_CALLOUT:
    case OP_SOD:
    case OP_SOM:
    case OP_EOD:
    case OP_EODN:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    cc += PRIV(OP_lengths)[*cc];
    break;

    case OP_CALLOUT_STR:
    cc += GET(cc, 1 + 2*LINK_SIZE);
    break;

    /* Skip over a subpattern that has a {0} or {0,x} quantifier */

    case OP_BRAZERO:
    case OP_BRAMINZERO:
    case OP_BRAPOSZERO:
    case OP_SKIPZERO:
    cc += PRIV(OP_lengths)[*cc];
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* Handle literal characters and + repetitions */

    case OP_CHAR:
    case OP_CHARI:
    case OP_NOT:
    case OP_NOTI:
    case OP_PLUS:
    case OP_PLUSI:
    case OP_MINPLUS:
    case OP_MINPLUSI:
    case OP_POSPLUS:
    case OP_POSPLUSI:
    case OP_NOTPLUS:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUS:
    case OP_NOTMINPLUSI:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSPLUSI:
    branchlength++;
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEPOSPLUS:
    branchlength++;
    cc += (cc[1] == OP_PROP || cc[1] == OP_NOTPROP)? 4 : 2;
    break;

    /* Handle exact repetitions. The count is already in characters, but we
    may need to skip over a multibyte character in UTF mode.  */

    case OP_EXACT:
    case OP_EXACTI:
    case OP_NOTEXACT:
    case OP_NOTEXACTI:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEEXACT:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE + ((cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP)? 2 : 0);
    break;

    /* Handle single-char non-literal matchers */

    case OP_PROP:
    case OP_NOTPROP:
    cc += 2;
    /* Fall through */

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_EXTUNI:
    case OP_HSPACE:
    case OP_NOT_HSPACE:
    case OP_VSPACE:
    case OP_NOT_VSPACE:
    branchlength++;
    cc++;
    break;

    /* "Any newline" might match two characters, but it also might match just
    one. */

    case OP_ANYNL:
    branchlength += 1;
    cc++;
    break;

    /* The single-byte matcher means we can't proceed in UTF mode. (In
    non-UTF mode \C will actually be turned into OP_ALLANY, so won't ever
    appear, but leave the code, just in case.) */

    case OP_ANYBYTE:
#ifdef SUPPORT_UNICODE
    if (utf) return -1;
#endif
    branchlength++;
    cc++;
    break;

    /* For repeated character types, we have to test for \p and \P, which have
    an extra two bytes of parameters. */

    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSQUERY:
    if (cc[1] == OP_PROP || cc[1] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEPOSUPTO:
    if (cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    /* Check a class for variable quantification */

    case OP_CLASS:
    case OP_NCLASS:
#ifdef SUPPORT_WIDE_CHARS
    case OP_XCLASS:
    /* The original code caused an unsigned overflow in 64 bit systems,
    so now we use a conditional statement. */
    if (op == OP_XCLASS)
      cc += GET(cc, 1);
    else
      cc += PRIV(OP_lengths)[OP_CLASS];
#else
    cc += PRIV(OP_lengths)[OP_CLASS];
#endif

    switch (*cc)
      {
      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      branchlength++;
      /* Fall through */

      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      branchlength += GET2(cc,1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      branchlength++;
      break;
      }
    break;

    /* Backreferences and subroutine calls (OP_RECURSE) are treated in the same
    way: we find the minimum length for the subpattern. A recursion
    (backreference or subroutine) causes an a flag to be set that causes the
    length of this branch to be ignored. The logic is that a recursion can only
    make sense if there is another alternative that stops the recursing. That
    will provide the minimum length (when no recursion happens).

    If PCRE2_MATCH_UNSET_BACKREF is set, a backreference to an unset bracket
    matches an empty string (by default it causes a matching failure), so in
    that case we must set the minimum length to zero. */

    /* Duplicate named pattern back reference. We cannot reliably find a length
    for this if duplicate numbers are present in the pattern. */

    case OP_DNREF:
    case OP_DNREFI:
    if (dupcapused) return -1;
    if ((re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
      {
      int count = GET2(cc, 1+IMM2_SIZE);
      PCRE2_UCHAR *slot =
        (PCRE2_UCHAR *)((uint8_t *)re + sizeof(pcre2_real_code)) +
          GET2(cc, 1) * re->name_entry_size;

      d = INT_MAX;

      /* Scan all groups with the same name; find the shortest. */

      while (count-- > 0)
        {
        int dd, i;
        recno = GET2(slot, 0);

        if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
          dd = backref_cache[recno];
        else
          {
          ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
          if (cs == NULL) return -2;
          do ce += GET(ce, 1); while (*ce == OP_ALT);
          if (cc > cs && cc < ce)    /* Simple recursion */
            {
            dd = 0;
            had_recurse = TRUE;
            }
          else
            {
            recurse_check *r = recurses;
            for (r = recurses; r != NULL; r = r->prev)
              if (r->group == cs) break;
            if (r != NULL)           /* Mutual recursion */
              {
              dd = 0;
              had_recurse = TRUE;
              }
            else
              {
              this_recurse.prev = recurses;
              this_recurse.group = cs;
              dd = find_minlength(re, cs, startcode, utf, &this_recurse,
                countptr, backref_cache);
              if (dd < 0) return dd;
              }
            }

          backref_cache[recno] = dd;
          for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
          backref_cache[0] = recno;
          }

        if (dd < d) d = dd;
        if (d <= 0) break;    /* No point looking at any more */
        slot += re->name_entry_size;
        }
      }
    else d = 0;
    cc += 1 + 2*IMM2_SIZE;
    goto REPEAT_BACK_REFERENCE;

    /* Single back reference. We cannot find a length for this if duplicate
    numbers are present in the pattern. */

    case OP_REF:
    case OP_REFI:
    if (dupcapused) return -1;
    recno = GET2(cc, 1);
    if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
      d = backref_cache[recno];
    else
      {
      int i;
      if ((re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
        {
        ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
        if (cs == NULL) return -2;
        do ce += GET(ce, 1); while (*ce == OP_ALT);
        if (cc > cs && cc < ce)    /* Simple recursion */
          {
          d = 0;
          had_recurse = TRUE;
          }
        else
          {
          recurse_check *r = recurses;
          for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
          if (r != NULL)           /* Mutual recursion */
            {
            d = 0;
            had_recurse = TRUE;
            }
          else
            {
            this_recurse.prev = recurses;
            this_recurse.group = cs;
            d = find_minlength(re, cs, startcode, utf, &this_recurse, countptr,
              backref_cache);
            if (d < 0) return d;
            }
          }
        }
      else d = 0;

      backref_cache[recno] = d;
      for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
      backref_cache[0] = recno;
      }

    cc += 1 + IMM2_SIZE;

    /* Handle repeated back references */

    REPEAT_BACK_REFERENCE:
    switch (*cc)
      {
      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      min = 0;
      cc++;
      break;

      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      min = 1;
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      min = GET2(cc, 1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      min = 1;
      break;
      }

     /* Take care not to overflow: (1) min and d are ints, so check that their
     product is not greater than INT_MAX. (2) branchlength is limited to
     UINT16_MAX (checked at the top of the loop). */

    if ((d > 0 && (INT_MAX/d) < min) || UINT16_MAX - branchlength < min*d)
      branchlength = UINT16_MAX;
    else branchlength += min * d;
    break;

    /* Recursion always refers to the first occurrence of a subpattern with a
    given number. Therefore, we can always make use of caching, even when the
    pattern contains multiple subpatterns with the same number. */

    case OP_RECURSE:
    cs = ce = (PCRE2_UCHAR *)startcode + GET(cc, 1);
    recno = GET2(cs, 1+LINK_SIZE);
    if (recno == prev_recurse_recno)
      {
      branchlength += prev_recurse_d;
      }
    else
      {
      do ce += GET(ce, 1); while (*ce == OP_ALT);
      if (cc > cs && cc < ce)    /* Simple recursion */
        had_recurse = TRUE;
      else
        {
        recurse_check *r = recurses;
        for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
        if (r != NULL)          /* Mutual recursion */
          had_recurse = TRUE;
        else
          {
          this_recurse.prev = recurses;
          this_recurse.group = cs;
          prev_recurse_d = find_minlength(re, cs, startcode, utf, &this_recurse,
            countptr, backref_cache);
          if (prev_recurse_d < 0) return prev_recurse_d;
          prev_recurse_recno = recno;
          branchlength += prev_recurse_d;
          }
        }
      }
    cc += 1 + LINK_SIZE + once_fudge;
    once_fudge = 0;
    break;

    /* Anything else does not or need not match a character. We can get the
    item's length from the table, but for those that can match zero occurrences
    of a character, we must take special action for UTF-8 characters. As it
    happens, the "NOT" versions of these opcodes are used at present only for
    ASCII characters, so they could be omitted from this list. However, in
    future that may change, so we include them here so as not to leave a
    gotcha for a future maintainer. */

    case OP_UPTO:
    case OP_UPTOI:
    case OP_NOTUPTO:
    case OP_NOTUPTOI:
    case OP_MINUPTO:
    case OP_MINUPTOI:
    case OP_NOTMINUPTO:
    case OP_NOTMINUPTOI:
    case OP_POSUPTO:
    case OP_POSUPTOI:
    case OP_NOTPOSUPTO:
    case OP_NOTPOSUPTOI:

    case OP_STAR:
    case OP_STARI:
    case OP_NOTSTAR:
    case OP_NOTSTARI:
    case OP_MINSTAR:
    case OP_MINSTARI:
    case OP_NOTMINSTAR:
    case OP_NOTMINSTARI:
    case OP_POSSTAR:
    case OP_POSSTARI:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSSTARI:

    case OP_QUERY:
    case OP_QUERYI:
    case OP_NOTQUERY:
    case OP_NOTQUERYI:
    case OP_MINQUERY:
    case OP_MINQUERYI:
    case OP_NOTMINQUERY:
    case OP_NOTMINQUERYI:
    case OP_POSQUERY:
    case OP_POSQUERYI:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSQUERYI:

    cc += PRIV(OP_lengths)[op];
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    /* Skip these, but we need to add in the name length. */

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_SKIP_ARG:
    case OP_THEN_ARG:
    cc += PRIV(OP_lengths)[op] + cc[1];
    break;

    /* The remaining opcodes are just skipped over. */

    case OP_CLOSE:
    case OP_COMMIT:
    case OP_FAIL:
    case OP_PRUNE:
    case OP_SET_SOM:
    case OP_SKIP:
    case OP_THEN:
    cc += PRIV(OP_lengths)[op];
    break;

    /* This should not occur: we list all opcodes explicitly so that when
    new ones get added they are properly considered. */

    default:
    return -3;
    }
  }
/* Control never gets here */
}